

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
interfaces::MakeCleanupHandler(interfaces *this,function<void_()> cleanup)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 *puVar7;
  undefined4 *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar7 = (undefined8 *)operator_new(0x28);
  lVar2 = *(long *)(in_RSI + 4);
  uVar3 = *(undefined8 *)(in_RSI + 6);
  if (lVar2 == 0) {
    puVar7[1] = 0;
    puVar7[2] = 0;
    puVar7[3] = 0;
  }
  else {
    *(undefined8 *)(in_RSI + 4) = 0;
    *(undefined8 *)(in_RSI + 6) = 0;
    uVar4 = in_RSI[1];
    uVar5 = in_RSI[2];
    uVar6 = in_RSI[3];
    *(undefined4 *)(puVar7 + 1) = *in_RSI;
    *(undefined4 *)((long)puVar7 + 0xc) = uVar4;
    *(undefined4 *)(puVar7 + 2) = uVar5;
    *(undefined4 *)((long)puVar7 + 0x14) = uVar6;
    puVar7[3] = lVar2;
  }
  *puVar7 = &PTR__CleanupHandler_00b03570;
  puVar7[4] = uVar3;
  *(undefined8 **)this = puVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> MakeCleanupHandler(std::function<void()> cleanup)
{
    return std::make_unique<common::CleanupHandler>(std::move(cleanup));
}